

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_buffered_data.cpp
# Opt level: O2

void __thiscall duckdb::SimpleBufferedData::Append(SimpleBufferedData *this,DataChunk *to_append)

{
  pointer pDVar1;
  Allocator *allocator;
  type other;
  idx_t iVar2;
  templated_unique_single_t chunk;
  unique_lock<std::mutex> lock;
  unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_> local_40;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_38;
  
  make_uniq<duckdb::DataChunk>();
  pDVar1 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *
                      )&local_40);
  allocator = Allocator::DefaultAllocator();
  DataChunk::GetTypes((vector<duckdb::LogicalType,_true> *)&local_38,to_append);
  DataChunk::Initialize(pDVar1,allocator,(vector<duckdb::LogicalType,_true> *)&local_38,0x800);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_38);
  other = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator*
                    ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *)
                     &local_40);
  DataChunk::Copy(to_append,other,0);
  pDVar1 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *
                      )&local_40);
  iVar2 = DataChunk::GetAllocationSize(pDVar1);
  ::std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)&local_38,&(this->super_BufferedData).glock);
  LOCK();
  (this->buffered_count).super___atomic_base<unsigned_long>._M_i =
       (this->buffered_count).super___atomic_base<unsigned_long>._M_i + iVar2;
  UNLOCK();
  ::std::
  deque<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>,std::allocator<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>>
  ::emplace_back<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>
            ((deque<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>,std::allocator<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>>
              *)&this->buffered_chunks,
             (unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *)
             &local_40);
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_38);
  ::std::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>::~unique_ptr
            (&local_40);
  return;
}

Assistant:

void SimpleBufferedData::Append(const DataChunk &to_append) {
	auto chunk = make_uniq<DataChunk>();
	chunk->Initialize(Allocator::DefaultAllocator(), to_append.GetTypes());
	to_append.Copy(*chunk, 0);
	auto allocation_size = chunk->GetAllocationSize();

	unique_lock<mutex> lock(glock);
	buffered_count += allocation_size;
	buffered_chunks.push(std::move(chunk));
}